

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

Util * __thiscall Util::getIndent_abi_cxx11_(Util *this,int level)

{
  size_type sVar1;
  mapped_type *pmVar2;
  int local_4c;
  int i;
  string local_38 [8];
  string tmp;
  int local_14;
  Util *pUStack_10;
  int level_local;
  
  local_14 = level;
  pUStack_10 = this;
  std::__cxx11::string::string(local_38);
  sVar1 = std::
          unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::count(&indentCache_abi_cxx11_,&local_14);
  if (sVar1 == 0) {
    for (local_4c = 0; local_4c < local_14; local_4c = local_4c + 1) {
      std::__cxx11::string::operator+=(local_38,'\t');
    }
    pmVar2 = std::
             unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&indentCache_abi_cxx11_,&local_14);
    std::__cxx11::string::operator=((string *)pmVar2,local_38);
    std::__cxx11::string::string((string *)this,local_38);
  }
  else {
    pmVar2 = std::
             unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&indentCache_abi_cxx11_,&local_14);
    std::__cxx11::string::string((string *)this,(string *)pmVar2);
  }
  std::__cxx11::string::~string(local_38);
  return this;
}

Assistant:

std::string Util::getIndent(int level)
{
	std::string tmp;

	if (indentCache.count(level) > 0)
		return indentCache[level];

	for (int i = 0; i < level; i++)
		tmp += '\t';

	indentCache[level] = tmp;

	return tmp;
}